

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O1

idx_t __thiscall duckdb::Pipeline::UpdateBatchIndex(Pipeline *this,idx_t old_index,idx_t new_index)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  idx_t iVar3;
  int iVar4;
  InternalException *pIVar5;
  _Base_ptr p_Var6;
  const_iterator __position;
  ulong local_58;
  string local_50;
  
  local_58 = new_index;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->batch_lock);
  if (iVar4 != 0) {
    ::std::__throw_system_error(iVar4);
  }
  if (*(ulong *)((this->batch_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1) <=
      local_58) {
    p_Var1 = &(this->batch_indexes)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = (this->batch_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &p_Var1->_M_header;
    for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < old_index]
        ) {
      if (*(ulong *)(p_Var2 + 1) >= old_index) {
        p_Var6 = p_Var2;
      }
    }
    __position._M_node = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
       (__position._M_node = p_Var6, old_index < *(ulong *)(p_Var6 + 1))) {
      __position._M_node = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)__position._M_node != p_Var1) {
      ::std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                          *)&this->batch_indexes,__position);
      ::std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_equal<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)&this->batch_indexes,&local_58);
      iVar3 = *(idx_t *)((this->batch_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                        + 1);
      pthread_mutex_unlock((pthread_mutex_t *)&this->batch_lock);
      return iVar3;
    }
    pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Batch index %llu was not found in set of active batch indexes",
               "");
    InternalException::InternalException<unsigned_long>(pIVar5,&local_50,old_index);
    __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "Processing batch index %llu, but previous min batch index was %llu","");
  InternalException::InternalException<unsigned_long,unsigned_long>
            (pIVar5,&local_50,local_58,
             *(unsigned_long *)
              ((this->batch_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1));
  __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t Pipeline::UpdateBatchIndex(idx_t old_index, idx_t new_index) {
	lock_guard<mutex> l(batch_lock);
	if (new_index < *batch_indexes.begin()) {
		throw InternalException("Processing batch index %llu, but previous min batch index was %llu", new_index,
		                        *batch_indexes.begin());
	}
	auto entry = batch_indexes.find(old_index);
	if (entry == batch_indexes.end()) {
		throw InternalException("Batch index %llu was not found in set of active batch indexes", old_index);
	}
	batch_indexes.erase(entry);
	batch_indexes.insert(new_index);
	return *batch_indexes.begin();
}